

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

date __thiscall jwt::payload::get_not_before(payload *this)

{
  claim *this_00;
  date dVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"nbf",&local_31);
  this_00 = get_payload_claim(this,&local_30);
  dVar1 = claim::as_date(this_00);
  std::__cxx11::string::~string((string *)&local_30);
  return (duration)dVar1.__d.__r;
}

Assistant:

const date get_not_before() const { return get_payload_claim("nbf").as_date(); }